

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_concat(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  ly_bool lVar1;
  LY_ERR LVar2;
  lysc_node *plVar3;
  char *pcVar4;
  size_t sVar5;
  lyxp_set_node *__ptr;
  char *format;
  ulong uVar6;
  long lVar7;
  ly_ctx *ctx;
  
  if ((options & 0x1c) == 0) {
    lVar7 = 1;
    __ptr = (lyxp_set_node *)0x0;
    for (uVar6 = 0; arg_count != uVar6; uVar6 = uVar6 + 1) {
      LVar2 = lyxp_set_cast(args[uVar6],LYXP_SET_STRING);
      if (LVar2 != LY_SUCCESS) {
        free(__ptr);
        return LVar2;
      }
      sVar5 = strlen((args[uVar6]->val).str);
      __ptr = (lyxp_set_node *)ly_realloc(__ptr,sVar5 + lVar7);
      if (__ptr == (lyxp_set_node *)0x0) {
        ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_concat");
        return LY_EMEM;
      }
      strcpy((char *)((long)__ptr + lVar7 + -1),(args[uVar6]->val).str);
      sVar5 = strlen((args[uVar6]->val).str);
      lVar7 = lVar7 + sVar5;
    }
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    (set->val).nodes = __ptr;
  }
  else {
    for (uVar6 = 0; arg_count != uVar6; uVar6 = uVar6 + 1) {
      if ((args[uVar6]->type == LYXP_SET_SCNODE_SET) &&
         (plVar3 = warn_get_scnode_in_ctx(args[uVar6]), plVar3 != (lysc_node *)0x0)) {
        if ((plVar3->nodetype & 0xc) == 0) {
          ctx = set->ctx;
          pcVar4 = lys_nodetype2str(plVar3->nodetype);
          format = "Argument #%u of %s is a %s node \"%s\".";
        }
        else {
          lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
          if (lVar1 != '\0') goto LAB_001a61ba;
          ctx = set->ctx;
          format = "Argument #%u of %s is node \"%s\", not of string-type.";
          pcVar4 = plVar3->name;
        }
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,(ulong)((int)uVar6 + 1),"xpath_concat",pcVar4);
      }
LAB_001a61ba:
    }
    set_scnode_clear_ctx(set,1);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_concat(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i;
    char *str = NULL;
    size_t used = 1;
    LY_ERR rc = LY_SUCCESS;
    struct lysc_node_leaf *sleaf;

    if (options & LYXP_SCNODE_ALL) {
        for (i = 0; i < arg_count; ++i) {
            if ((args[i]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[i]))) {
                if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                    LOGWRN(set->ctx, "Argument #%" PRIu32 " of %s is a %s node \"%s\".",
                            i + 1, __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
                } else if (!warn_is_string_type(sleaf->type)) {
                    LOGWRN(set->ctx, "Argument #%" PRIu32 " of %s is node \"%s\", not of string-type.", i + 1, __func__,
                            sleaf->name);
                }
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    for (i = 0; i < arg_count; ++i) {
        rc = lyxp_set_cast(args[i], LYXP_SET_STRING);
        if (rc != LY_SUCCESS) {
            free(str);
            return rc;
        }

        str = ly_realloc(str, (used + strlen(args[i]->val.str)) * sizeof(char));
        LY_CHECK_ERR_RET(!str, LOGMEM(set->ctx), LY_EMEM);
        strcpy(str + used - 1, args[i]->val.str);
        used += strlen(args[i]->val.str);
    }

    /* free, kind of */
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    set->val.str = str;

    return LY_SUCCESS;
}